

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void nifti_free_NBL(nifti_brick_list *NBL)

{
  int iVar1;
  void **__ptr;
  long lVar2;
  
  __ptr = NBL->bricks;
  if (__ptr != (void **)0x0) {
    iVar1 = NBL->nbricks;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (NBL->bricks[lVar2] != (void *)0x0) {
          free(NBL->bricks[lVar2]);
          iVar1 = NBL->nbricks;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
      __ptr = NBL->bricks;
    }
    free(__ptr);
    NBL->bricks = (void **)0x0;
  }
  NBL->nbricks = 0;
  NBL->bsize = 0;
  return;
}

Assistant:

void nifti_free_NBL( nifti_brick_list * NBL )
{
   int c;

   if( NBL->bricks ){
      for( c = 0; c < NBL->nbricks; c++ )
         if( NBL->bricks[c] ) free(NBL->bricks[c]);
      free(NBL->bricks);
      NBL->bricks = NULL;
   }

   NBL->bsize = NBL->nbricks = 0;
}